

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

wchar_t terminal_clear_arrow(EditLine *el,wchar_t *name)

{
  funckey_t *pfVar1;
  int iVar2;
  long lVar3;
  
  pfVar1 = (el->el_terminal).t_fkey;
  lVar3 = 0;
  do {
    iVar2 = wcscmp(name,*(wchar_t **)((long)&pfVar1->name + lVar3));
    if (iVar2 == 0) {
      *(undefined4 *)((long)&pfVar1->type + lVar3) = 2;
      return L'\0';
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xe0);
  return L'\xffffffff';
}

Assistant:

libedit_private int
terminal_clear_arrow(EditLine *el, const wchar_t *name)
{
	funckey_t *arrow = el->el_terminal.t_fkey;
	int i;

	for (i = 0; i < A_K_NKEYS; i++)
		if (wcscmp(name, arrow[i].name) == 0) {
			arrow[i].type = XK_NOD;
			return 0;
		}
	return -1;
}